

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::Message::DebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  Message *this_local;
  string *debug_string;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TextFormat::PrintToString(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Message::DebugString() const {
  string debug_string;

  TextFormat::PrintToString(*this, &debug_string);

  return debug_string;
}